

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::load_state
          (session_impl *this,bdecode_node *e,save_state_flags_t flags)

{
  undefined8 uVar1;
  bool bVar2;
  type_t tVar3;
  reference this_00;
  __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar4;
  bool local_2b9;
  shared_ptr<libtorrent::plugin> *ext;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> sett;
  string_view local_238;
  bdecode_node local_228;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> pack;
  string_view local_188;
  bdecode_node local_178;
  uint local_138;
  uint local_134;
  uint local_130 [3];
  uint local_124;
  dht_state local_120;
  string_view local_c8;
  bdecode_node local_b8;
  uint local_74;
  uint local_70;
  uint local_6c;
  byte local_65;
  undefined4 local_64;
  undefined1 local_60 [3];
  bool need_update_dht;
  bdecode_node settings;
  bdecode_node *e_local;
  session_impl *this_local;
  save_state_flags_t flags_local;
  
  settings._56_8_ = e;
  bdecode_node::bdecode_node((bdecode_node *)local_60);
  tVar3 = bdecode_node::type((bdecode_node *)settings._56_8_);
  if (tVar3 == dict_t) {
    local_65 = 0;
    local_74 = 4;
    local_70 = flags.m_val;
    local_6c = (uint)libtorrent::flags::operator&
                               (flags.m_val,
                                (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                )4);
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_6c);
    uVar1 = settings._56_8_;
    if (bVar2) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c8,"dht state");
      bdecode_node::dict_find_dict(&local_b8,(bdecode_node *)uVar1,local_c8);
      bdecode_node::operator=((bdecode_node *)local_60,&local_b8);
      bdecode_node::~bdecode_node(&local_b8);
      bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_60);
      if (bVar2) {
        libtorrent::dht::read_dht_state(&local_120,(bdecode_node *)local_60);
        libtorrent::dht::dht_state::operator=(&this->m_dht_state,&local_120);
        libtorrent::dht::dht_state::~dht_state(&local_120);
        local_65 = 1;
      }
    }
    local_130[1] = 1;
    local_130[2] = flags.m_val;
    local_124 = (uint)libtorrent::flags::operator&
                                (flags.m_val,
                                 (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                  )1);
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_124);
    local_2b9 = true;
    if (!bVar2) {
      local_138 = 2;
      local_134 = flags.m_val;
      local_130[0] = (uint)libtorrent::flags::operator&
                                     (flags.m_val,
                                      (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                       )2);
      local_2b9 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)local_130);
    }
    uVar1 = settings._56_8_;
    if (local_2b9 != false) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_188,"settings");
      bdecode_node::dict_find_dict(&local_178,(bdecode_node *)uVar1,local_188);
      bdecode_node::operator=((bdecode_node *)local_60,&local_178);
      bdecode_node::~bdecode_node(&local_178);
      bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_60);
      if (bVar2) {
        load_pack_from_dict((settings_pack *)&stack0xfffffffffffffe28,(bdecode_node *)local_60);
        settings_pack::clear((settings_pack *)&stack0xfffffffffffffe28,0);
        settings_pack::clear((settings_pack *)&stack0xfffffffffffffe28,10);
        apply_settings_pack_impl
                  (this,(vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
                         *)&stack0xfffffffffffffe28);
        local_65 = 0;
        settings_pack::~settings_pack((settings_pack *)&stack0xfffffffffffffe28);
      }
    }
    local_1e4 = 2;
    local_1e0 = flags.m_val;
    local_1dc = (uint)libtorrent::flags::operator&
                                (flags.m_val,
                                 (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                  )2);
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_1dc);
    uVar1 = settings._56_8_;
    if (bVar2) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_238,"dht");
      bdecode_node::dict_find_dict(&local_228,(bdecode_node *)uVar1,local_238);
      bdecode_node::operator=((bdecode_node *)local_60,&local_228);
      bdecode_node::~bdecode_node(&local_228);
      bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_60);
      if (bVar2) {
        settings_pack::settings_pack((settings_pack *)&__range2);
        apply_deprecated_dht_settings
                  ((vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
                    *)&__range2,(bdecode_node *)local_60);
        apply_settings_pack_impl
                  (this,(vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
                         *)&__range2);
        settings_pack::~settings_pack((settings_pack *)&__range2);
      }
    }
    if ((local_65 & 1) != 0) {
      start_dht(this);
    }
    this_00 = ::std::
              array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
              ::operator[](&this->m_ses_extensions,0);
    __end2 = ::std::
             vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             ::begin(this_00);
    ext = (shared_ptr<libtorrent::plugin> *)
          ::std::
          vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
          ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                                       *)&ext), bVar2) {
      this_01 = (__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )__gnu_cxx::
                 __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                 ::operator*(&__end2);
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01);
      (*peVar4->_vptr_plugin[0xc])(peVar4,settings._56_8_);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
      ::operator++(&__end2);
    }
    local_64 = 0;
  }
  else {
    local_64 = 1;
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_60);
  return;
}

Assistant:

void session_impl::load_state(bdecode_node const* e
		, save_state_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());

		bdecode_node settings;
		if (e->type() != bdecode_node::dict_t) return;

#ifndef TORRENT_DISABLE_DHT
		bool need_update_dht = false;
		if (flags & session_handle::save_dht_state)
		{
			settings = e->dict_find_dict("dht state");
			if (settings)
			{
				m_dht_state = dht::read_dht_state(settings);
				need_update_dht = true;
			}
		}
#endif

#if TORRENT_ABI_VERSION == 1
		bool need_update_proxy = false;
		if (flags & session_handle::save_proxy)
		{
			settings = e->dict_find_dict("proxy");
			if (settings)
			{
				m_settings.bulk_set([&settings](session_settings_single_thread& s)
				{
					bdecode_node val;
					val = settings.dict_find_int("port");
					if (val) s.set_int(settings_pack::proxy_port, int(val.int_value()));
					val = settings.dict_find_int("type");
					if (val) s.set_int(settings_pack::proxy_type, int(val.int_value()));
					val = settings.dict_find_int("proxy_hostnames");
					if (val) s.set_bool(settings_pack::proxy_hostnames, val.int_value() != 0);
					val = settings.dict_find_int("proxy_peer_connections");
					if (val) s.set_bool(settings_pack::proxy_peer_connections, val.int_value() != 0);
					val = settings.dict_find_string("hostname");
					if (val) s.set_str(settings_pack::proxy_hostname, std::string(val.string_value()));
					val = settings.dict_find_string("password");
					if (val) s.set_str(settings_pack::proxy_password, std::string(val.string_value()));
					val = settings.dict_find_string("username");
					if (val) s.set_str(settings_pack::proxy_username, std::string(val.string_value()));
				});
				need_update_proxy = true;
			}
		}

		settings = e->dict_find_dict("encryption");
		if (settings)
		{
			m_settings.bulk_set([&settings](session_settings_single_thread& s)
			{
				bdecode_node val;
				val = settings.dict_find_int("prefer_rc4");
				if (val) s.set_bool(settings_pack::prefer_rc4, val.int_value() != 0);
				val = settings.dict_find_int("out_enc_policy");
				if (val) s.set_int(settings_pack::out_enc_policy, int(val.int_value()));
				val = settings.dict_find_int("in_enc_policy");
				if (val) s.set_int(settings_pack::in_enc_policy, int(val.int_value()));
				val = settings.dict_find_int("allowed_enc_level");
				if (val) s.set_int(settings_pack::allowed_enc_level, int(val.int_value()));
			});
		}
#endif

		if ((flags & session_handle::save_settings)
			|| (flags & session_handle::save_dht_settings)
			)
		{
			settings = e->dict_find_dict("settings");
			if (settings)
			{
				// apply_settings_pack will update dht and proxy
				settings_pack pack = load_pack_from_dict(settings);

				// these settings are not loaded from state
				// they are set by the client software, not configured by users
				pack.clear(settings_pack::user_agent);
				pack.clear(settings_pack::peer_fingerprint);

				apply_settings_pack_impl(pack);
#ifndef TORRENT_DISABLE_DHT
				need_update_dht = false;
#endif
#if TORRENT_ABI_VERSION == 1
				need_update_proxy = false;
#endif
			}
		}

		if (flags & session_handle::save_dht_settings)
		{
			// This is here for backwards compatibility, to support loading state
			// files in the previous file format, where the DHT settings were in
			// its own dictionary
			settings = e->dict_find_dict("dht");
			if (settings)
			{
				settings_pack sett;
				aux::apply_deprecated_dht_settings(sett, settings);
				apply_settings_pack_impl(sett);
			}
		}

#ifndef TORRENT_DISABLE_DHT
		if (need_update_dht) start_dht();
#endif
#if TORRENT_ABI_VERSION == 1
		if (need_update_proxy) update_proxy();
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_ses_extensions[plugins_all_idx])
		{
			ext->load_state(*e);
		}
#endif
	}